

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall PClassActor::Finalize(PClassActor *this,FStateDefinitions *statedef)

{
  AActor *defaults;
  
  defaults = (AActor *)(this->super_PClass).Defaults;
  FStateDefinitions::FinishStates(statedef,this,defaults);
  FStateDefinitions::InstallStates(statedef,this,defaults);
  FStateDefinitions::MakeStateDefines(statedef,(PClassActor *)0x0);
  return;
}

Assistant:

void PClassActor::Finalize(FStateDefinitions &statedef)
{
	AActor *defaults = (AActor*)Defaults;

	try
	{
		statedef.FinishStates(this, defaults);
	}
	catch (CRecoverableError &)
	{
		statedef.MakeStateDefines(NULL);
		throw;
	}
	statedef.InstallStates(this, defaults);
	statedef.MakeStateDefines(NULL);
}